

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderUtil.cpp
# Opt level: O2

DataType glu::getDataTypeBoolVec(int vecSize)

{
  return vecSize + TYPE_UINT_VEC4;
}

Assistant:

DataType getDataTypeVector (DataType scalarType, int size)
{
	DE_ASSERT(deInRange32(size, 1, 4));
	switch (scalarType)
	{
		case TYPE_FLOAT:
		case TYPE_DOUBLE:
		case TYPE_INT:
		case TYPE_UINT:
		case TYPE_BOOL:
			return (DataType)((int)scalarType + size - 1);
		default:
			return TYPE_INVALID;
	}
}